

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O1

bool __thiscall
vkt::texture::SampleVerifier::verifySampleFiltered
          (SampleVerifier *this,Vec4 *result,IVec3 *baseTexelHiIn,IVec3 *baseTexelLoIn,
          IVec3 *texelGridOffsetHiIn,IVec3 *texelGridOffsetLoIn,int layer,int levelHi,
          Vec2 *lodFracBounds,VkFilter filter,VkSamplerMipmapMode mipmapFilter,ostream *report)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int i;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int level;
  Vec4 *pVVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  Vec4 idealSampleHiMax;
  Vec4 idealSampleHiMin;
  Vec3 roundedWeightsHi;
  IVec3 texelGridOffsetLo;
  IVec3 texelGridOffsetHi;
  IVec3 baseTexelLo;
  IVec3 baseTexelHi;
  Vec4 idealSampleMax;
  Vec4 idealSampleMin;
  Vector<float,_3> res_2;
  Vec4 idealSampleLoMax;
  Vec4 idealSampleLoMin;
  Interval local_1b8;
  Vec4 *local_1a0;
  Vector<float,_4> local_198;
  Vector<float,_4> local_188;
  Interval local_170;
  Vector<int,_3> local_158;
  Vector<int,_3> local_148;
  Vector<int,_3> local_138;
  Vector<int,_3> local_128;
  Vector<float,_4> local_118;
  Vector<float,_4> local_108;
  Interval local_f0;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  FloatFormat *local_b8;
  double local_b0;
  Interval local_a8;
  Interval local_90;
  Interval local_78;
  Interval local_60;
  Interval local_48;
  
  iVar2 = this->m_coordBits;
  local_128.m_data[2] = baseTexelHiIn->m_data[2];
  local_128.m_data._0_8_ = *(undefined8 *)baseTexelHiIn->m_data;
  iVar10 = 1 << ((byte)this->m_mipmapBits & 0x1f);
  local_138.m_data[2] = baseTexelLoIn->m_data[2];
  local_138.m_data._0_8_ = *(undefined8 *)baseTexelLoIn->m_data;
  local_148.m_data[2] = texelGridOffsetHiIn->m_data[2];
  local_148.m_data._0_8_ = *(undefined8 *)texelGridOffsetHiIn->m_data;
  local_158.m_data[2] = texelGridOffsetLoIn->m_data[2];
  local_158.m_data._0_8_ = *(undefined8 *)texelGridOffsetLoIn->m_data;
  fVar13 = (float)iVar10;
  level = (uint)(levelHi < this->m_imParams->levels + -1) + levelHi;
  local_1a0 = result;
  fVar11 = floorf(lodFracBounds->m_data[0] * fVar13);
  fVar12 = ceilf(lodFracBounds->m_data[1] * fVar13);
  iVar4 = 0;
  if (0 < (int)fVar11) {
    iVar4 = (int)fVar11;
  }
  if ((int)fVar12 < iVar10) {
    iVar10 = (int)fVar12;
  }
  std::__ostream_insert<char,std::char_traits<char>>(report,"Testing at base texel ",0x16);
  poVar5 = tcu::operator<<(report,&local_128);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = tcu::operator<<(poVar5,&local_138);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," offset ",8);
  poVar5 = tcu::operator<<(poVar5,&local_148);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = tcu::operator<<(poVar5,&local_158);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  local_188.m_data[0] = 0.0;
  local_188.m_data[1] = 0.0;
  local_188.m_data[2] = 0.0;
  local_188.m_data[3] = 0.0;
  local_198.m_data[0] = 0.0;
  local_198.m_data[1] = 0.0;
  local_198.m_data[2] = 0.0;
  local_198.m_data[3] = 0.0;
  local_c8.m_data[0] = 0.0;
  local_c8.m_data[1] = 0.0;
  local_c8.m_data[2] = 0.0;
  local_c8.m_data[3] = 0.0;
  local_d8.m_data[0] = 0.0;
  local_d8.m_data[1] = 0.0;
  local_d8.m_data[2] = 0.0;
  local_d8.m_data[3] = 0.0;
  if (filter == VK_FILTER_LINEAR) {
    util::wrapTexelGridCoordLinear(&local_128,&local_148,this->m_coordBits,this->m_imParams->dim);
    if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
      util::wrapTexelGridCoordLinear(&local_138,&local_158,this->m_coordBits,this->m_imParams->dim);
    }
    local_1b8.m_lo = (double)((ulong)local_1b8.m_lo._4_4_ << 0x20);
    local_1b8.m_hasNaN = false;
    local_1b8._1_7_ = 0;
    lVar6 = 0;
    do {
      *(float *)(&local_1b8.m_hasNaN + lVar6 * 4) = (float)local_148.m_data[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    fVar11 = (float)(1 << ((byte)iVar2 & 0x1f));
    local_170.m_lo = (double)((ulong)local_170.m_lo & 0xffffffff00000000);
    local_170._0_8_ = 0;
    lVar6 = 0;
    do {
      *(float *)(&local_170.m_hasNaN + lVar6 * 4) =
           *(float *)(&local_1b8.m_hasNaN + lVar6 * 4) / fVar11;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_f0.m_lo._0_4_ = 0;
    local_f0.m_hasNaN = false;
    local_f0._1_7_ = 0;
    lVar6 = 0;
    do {
      *(float *)(&local_f0.m_hasNaN + lVar6 * 4) = (float)local_158.m_data[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_1b8.m_lo = (double)((ulong)local_1b8.m_lo & 0xffffffff00000000);
    local_1b8._0_8_ = 0;
    lVar6 = 0;
    do {
      *(float *)(&local_1b8.m_hasNaN + lVar6 * 4) =
           *(float *)(&local_f0.m_hasNaN + lVar6 * 4) / fVar11;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    std::__ostream_insert<char,std::char_traits<char>>(report,"Computed weights: ",0x12);
    poVar5 = tcu::operator<<(report,(Vector<float,_3> *)&local_170);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    poVar5 = tcu::operator<<(poVar5,(Vector<float,_3> *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    getFilteredSample(this,&local_128,(Vec3 *)&local_170,layer,levelHi,&local_188,&local_198);
    std::__ostream_insert<char,std::char_traits<char>>(report,"Ideal hi sample: ",0x11);
    poVar5 = tcu::operator<<(report,&local_188);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," through ",9);
    poVar5 = tcu::operator<<(poVar5,&local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    pVVar9 = local_1a0;
    if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
      getFilteredSample(this,&local_138,(Vec3 *)&local_1b8,layer,level,&local_c8,&local_d8);
      std::__ostream_insert<char,std::char_traits<char>>(report,"Ideal lo sample: ",0x11);
      poVar5 = tcu::operator<<(report,&local_c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," through ",9);
      poVar5 = tcu::operator<<(poVar5,&local_d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      pVVar9 = local_1a0;
    }
  }
  else {
    fetchTexel(this,&local_128,layer,levelHi,VK_FILTER_NEAREST,&local_188,&local_198);
    std::__ostream_insert<char,std::char_traits<char>>(report,"Ideal hi sample: ",0x11);
    poVar5 = tcu::operator<<(report,&local_188);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," through ",9);
    poVar5 = tcu::operator<<(poVar5,&local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    pVVar9 = local_1a0;
    if (mipmapFilter != VK_SAMPLER_MIPMAP_MODE_LINEAR) goto LAB_008433b6;
    fetchTexel(this,&local_138,layer,level,VK_FILTER_NEAREST,&local_c8,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(report,"Ideal lo sample: ",0x11);
    poVar5 = tcu::operator<<(report,&local_c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," through ",9);
    poVar5 = tcu::operator<<(poVar5,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  }
  if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
    if (iVar10 < iVar4) {
      return false;
    }
    local_b8 = &this->m_filteringPrecision;
    do {
      fVar11 = (float)iVar4 / fVar13;
      std::__ostream_insert<char,std::char_traits<char>>(report,"Testing at mipmap weight ",0x19);
      dVar16 = (double)fVar11;
      poVar5 = std::ostream::_M_insert<double>(dVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      local_108.m_data[0] = 0.0;
      local_108.m_data[1] = 0.0;
      local_108.m_data[2] = 0.0;
      local_108.m_data[3] = 0.0;
      local_118.m_data[0] = 0.0;
      local_118.m_data[1] = 0.0;
      local_118.m_data[2] = 0.0;
      local_118.m_data[3] = 0.0;
      bVar1 = NAN(fVar11);
      dVar14 = INFINITY;
      if (!bVar1) {
        dVar14 = dVar16;
      }
      dVar15 = -INFINITY;
      if (!bVar1) {
        dVar15 = dVar16;
      }
      fVar11 = 1.0 - fVar11;
      local_b0 = -INFINITY;
      dVar16 = INFINITY;
      if (!NAN(fVar11)) {
        local_b0 = (double)fVar11;
        dVar16 = local_b0;
      }
      lVar6 = 0;
      do {
        local_170.m_lo = (double)*(float *)((long)local_c8.m_data + lVar6);
        local_170.m_hi = (double)*(float *)((long)local_d8.m_data + lVar6);
        local_170._0_8_ = local_170._0_8_ & 0xffffffffffffff00;
        local_1b8.m_lo = (double)*(float *)((long)local_188.m_data + lVar6);
        local_1b8.m_hi = (double)*(float *)((long)local_198.m_data + lVar6);
        local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffffffffff00;
        local_90.m_hasNaN = bVar1;
        local_90.m_lo = dVar14;
        local_90.m_hi = dVar15;
        tcu::operator*(&local_60,&local_90,&local_170);
        local_a8.m_hi = local_b0;
        local_a8.m_hasNaN = NAN(fVar11);
        local_a8.m_lo = dVar16;
        tcu::operator*(&local_78,&local_a8,&local_1b8);
        tcu::operator+(&local_48,&local_60,&local_78);
        tcu::FloatFormat::roundOut(&local_f0,local_b8,&local_48,false);
        *(float *)((long)local_108.m_data + lVar6) =
             (float)(double)CONCAT44(local_f0.m_lo._4_4_,local_f0.m_lo._0_4_);
        *(float *)((long)local_118.m_data + lVar6) = (float)local_f0.m_hi;
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(report,"Ideal sample: ",0xe);
      poVar5 = tcu::operator<<(report,&local_108);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," through ",9);
      poVar5 = tcu::operator<<(poVar5,&local_118);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((local_108.m_data[0] <= local_1a0->m_data[0]) &&
         (local_1a0->m_data[0] <= local_118.m_data[0])) {
        lVar6 = 1;
        do {
          lVar8 = lVar6;
          if ((lVar8 == 4) || (fVar11 = local_1a0->m_data[lVar8], fVar11 < local_108.m_data[lVar8]))
          break;
          lVar6 = lVar8 + 1;
        } while (fVar11 < local_118.m_data[lVar8] || fVar11 == local_118.m_data[lVar8]);
        if (2 < lVar8 - 1U) {
          return true;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(report,"Failed comparison\n",0x12);
      iVar4 = iVar4 + 1;
      if (iVar10 < iVar4) {
        return false;
      }
    } while( true );
  }
LAB_008433b6:
  if ((local_188.m_data[0] <= pVVar9->m_data[0]) && (pVVar9->m_data[0] <= local_198.m_data[0])) {
    uVar3 = 0;
    do {
      uVar7 = uVar3;
      if ((uVar7 == 3) || (fVar11 = pVVar9->m_data[uVar7 + 1], fVar11 < local_188.m_data[uVar7 + 1])
         ) break;
      uVar3 = uVar7 + 1;
    } while (fVar11 < local_198.m_data[uVar7 + 1] || fVar11 == local_198.m_data[uVar7 + 1]);
    if (2 < uVar7) {
      return true;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(report,"Failed comparison\n",0x12);
  return false;
}

Assistant:

bool SampleVerifier::verifySampleFiltered (const Vec4&			result,
										   const IVec3&			baseTexelHiIn,
										   const IVec3&			baseTexelLoIn,
										   const IVec3&			texelGridOffsetHiIn,
										   const IVec3&			texelGridOffsetLoIn,
										   int					layer,
										   int					levelHi,
										   const Vec2&			lodFracBounds,
										   VkFilter				filter,
										   VkSamplerMipmapMode	mipmapFilter,
										   std::ostream&		report) const
{
	DE_ASSERT(layer < m_imParams.arrayLayers);
	DE_ASSERT(levelHi < m_imParams.levels);

	const int	coordSteps			= 1 << m_coordBits;
	const int	lodSteps			= 1 << m_mipmapBits;
	const int	levelLo				= (levelHi < m_imParams.levels - 1) ? levelHi + 1 : levelHi;

	IVec3		baseTexelHi			= baseTexelHiIn;
	IVec3		baseTexelLo			= baseTexelLoIn;
	IVec3		texelGridOffsetHi	= texelGridOffsetHiIn;
	IVec3		texelGridOffsetLo	= texelGridOffsetLoIn;
	deInt32		lodStepsMin			= 0;
	deInt32		lodStepsMax			= 0;

	getMipmapStepBounds(lodFracBounds, lodStepsMin, lodStepsMax);

	report << "Testing at base texel " << baseTexelHi << ", " << baseTexelLo << " offset " << texelGridOffsetHi << ", " << texelGridOffsetLo << "\n";

	Vec4 idealSampleHiMin;
	Vec4 idealSampleHiMax;
	Vec4 idealSampleLoMin;
	Vec4 idealSampleLoMax;

	// Get ideal samples at steps at each mipmap level

	if (filter == VK_FILTER_LINEAR)
	{
		// Adjust texel grid coordinates for linear filtering
		wrapTexelGridCoordLinear(baseTexelHi, texelGridOffsetHi, m_coordBits, m_imParams.dim);

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
			wrapTexelGridCoordLinear(baseTexelLo, texelGridOffsetLo, m_coordBits, m_imParams.dim);
		}

		const Vec3 roundedWeightsHi = texelGridOffsetHi.asFloat() / (float)coordSteps;
		const Vec3 roundedWeightsLo = texelGridOffsetLo.asFloat() / (float)coordSteps;

		report << "Computed weights: " << roundedWeightsHi << ", " << roundedWeightsLo << "\n";

	    getFilteredSample(baseTexelHi, roundedWeightsHi, layer, levelHi, idealSampleHiMin, idealSampleHiMax);

		report << "Ideal hi sample: " << idealSampleHiMin << " through " << idealSampleHiMax << "\n";

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
		    getFilteredSample(baseTexelLo, roundedWeightsLo, layer, levelLo, idealSampleLoMin, idealSampleLoMax);

			report << "Ideal lo sample: " << idealSampleLoMin << " through " << idealSampleLoMax << "\n";
		}
	}
	else
	{
	    fetchTexel(baseTexelHi, layer, levelHi, VK_FILTER_NEAREST, idealSampleHiMin, idealSampleHiMax);

		report << "Ideal hi sample: " << idealSampleHiMin << " through " << idealSampleHiMax << "\n";

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
		    fetchTexel(baseTexelLo, layer, levelLo, VK_FILTER_NEAREST, idealSampleLoMin, idealSampleLoMax);

			report << "Ideal lo sample: " << idealSampleLoMin << " through " << idealSampleLoMax << "\n";
		}
	}

	// Test ideal samples based on mipmap filtering mode

	if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
	{
		for (deInt32 lodStep = lodStepsMin; lodStep <= lodStepsMax; ++lodStep)
		{
			float weight = (float)lodStep / (float)lodSteps;

			report << "Testing at mipmap weight " << weight << "\n";

			Vec4 idealSampleMin;
			Vec4 idealSampleMax;

			for (int compNdx = 0; compNdx < 4; ++compNdx)
			{
				const Interval idealSampleLo(false, idealSampleLoMin[compNdx], idealSampleLoMax[compNdx]);
				const Interval idealSampleHi(false, idealSampleHiMin[compNdx], idealSampleHiMax[compNdx]);

				const Interval idealSample
					= m_filteringPrecision.roundOut(Interval(weight) * idealSampleLo + Interval(1.0f - weight) * idealSampleHi, false);

				idealSampleMin[compNdx] = (float)idealSample.lo();
				idealSampleMax[compNdx] = (float)idealSample.hi();
			}

			report << "Ideal sample: " << idealSampleMin << " through " << idealSampleMax << "\n";

			if (isInRange(result, idealSampleMin, idealSampleMax))
			{
				return true;
			}
			else
			{
				report << "Failed comparison\n";
			}
		}
	}
	else
	{
		if (isInRange(result, idealSampleHiMin, idealSampleHiMax))
		{
			return true;
		}
		else
		{
			report << "Failed comparison\n";
		}
	}

	return false;
}